

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O2

void byte_swap(BigArrayIter *iter,size_t nmemb)

{
  undefined1 uVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  
  iVar3 = big_file_dtype_itemsize(iter->array->dtype);
  if (iVar3 != 1) {
    sVar6 = 0;
    sVar7 = (ulong)(uint)(iVar3 >> 1);
    if (iVar3 >> 1 < 1) {
      sVar7 = sVar6;
    }
    for (; sVar6 != nmemb; sVar6 = sVar6 + 1) {
      pvVar2 = iter->dataptr;
      iVar4 = iVar3;
      for (sVar5 = 0; iVar4 = iVar4 + -1, sVar7 != sVar5; sVar5 = sVar5 + 1) {
        uVar1 = *(undefined1 *)((long)pvVar2 + sVar5);
        *(undefined1 *)((long)pvVar2 + sVar5) = *(undefined1 *)((long)pvVar2 + (long)iVar4);
        *(undefined1 *)((long)pvVar2 + (long)iVar4) = uVar1;
      }
      big_array_iter_advance(iter);
    }
  }
  return;
}

Assistant:

static void
byte_swap(BigArrayIter * iter, size_t nmemb)
{
    /* swap a buffer in-place */
    int elsize = big_file_dtype_itemsize(iter->array->dtype);
    if(elsize == 1) return;
    /* need byte swap; do it now on buf2 */
    /* XXX: this may still be wrong. */
    ptrdiff_t i;
    int half = elsize >> 1;
    for(i = 0; i < nmemb; i ++) {
        int j;
        char * ptr = iter->dataptr;
        for(j = 0; j < half; j ++) {
            char tmp = ptr[j];
            ptr[j] = ptr[elsize - j - 1];
            ptr[elsize - j - 1] = tmp;
        }
        big_array_iter_advance(iter);
    }
}